

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_get_array_dim(coda_cursor_conflict *cursor,int *num_dims,long *dim)

{
  coda_dynamic_type_struct *pcVar1;
  long lVar2;
  int local_3c;
  int i;
  coda_mem_array *array;
  coda_mem_type *type;
  long *dim_local;
  int *num_dims_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if (pcVar1[1].backend == 2) {
    cursor_local._4_4_ = coda_ascbin_cursor_get_array_dim(cursor,num_dims,dim);
  }
  else {
    if (pcVar1[1].backend != coda_backend_binary) {
      __assert_fail("type->tag == tag_mem_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x19d,"int coda_mem_cursor_get_array_dim(const coda_cursor *, int *, long *)");
    }
    pcVar1 = cursor->stack[cursor->n + -1].type;
    lVar2._0_4_ = pcVar1->definition[1].type_class;
    lVar2._4_4_ = pcVar1->definition[1].read_type;
    if (lVar2 < 0) {
      *num_dims = 1;
      *dim = *(long *)(pcVar1 + 2);
    }
    else {
      *num_dims = *(int *)&pcVar1->definition[1].name;
      for (local_3c = 0; local_3c < *(int *)&pcVar1->definition[1].name; local_3c = local_3c + 1) {
        dim[local_3c] = (long)(&pcVar1->definition[1].description)[local_3c];
      }
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;
    coda_mem_array *array;

    if (type->tag == tag_mem_data)
    {
        return coda_ascbin_cursor_get_array_dim(cursor, num_dims, dim);
    }

    assert(type->tag == tag_mem_array);
    array = (coda_mem_array *)cursor->stack[cursor->n - 1].type;
    if (array->definition->num_elements >= 0)
    {
        int i;

        *num_dims = array->definition->num_dims;
        for (i = 0; i < array->definition->num_dims; i++)
        {
            dim[i] = array->definition->dim[i];
        }
    }
    else
    {
        *num_dims = 1;
        dim[0] = array->num_elements;
    }

    return 0;
}